

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O1

int uv_spawn(uv_loop_t *loop,uv_process_t *process,uv_process_options_t *options)

{
  uint *puVar1;
  uv__queue *puVar2;
  uv_stdio_container_t *puVar3;
  long lVar4;
  uv_loop_t *puVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int (*pipes) [2];
  long *plVar9;
  int *piVar10;
  ssize_t sVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  int (*fds) [2];
  ulong uVar15;
  uv_process_t *puVar16;
  long lVar17;
  int signal_pipe [2];
  int pipes_storage [8] [2];
  int status;
  undefined8 local_1a8;
  int local_19c;
  uv_process_t *local_198;
  uv__queue *local_190;
  uv_loop_t *local_188;
  ulong local_180;
  int local_178 [18];
  __sigset_t local_130;
  sigset_t local_b0;
  
  if (options->file == (char *)0x0) {
    __assert_fail("options->file != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/process.c"
                  ,0x3cb,"int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
  if (0x7f < options->flags) {
    __assert_fail("!(options->flags & ~(UV_PROCESS_DETACHED | UV_PROCESS_SETGID | UV_PROCESS_SETUID | UV_PROCESS_WINDOWS_HIDE | UV_PROCESS_WINDOWS_HIDE_CONSOLE | UV_PROCESS_WINDOWS_HIDE_GUI | UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/process.c"
                  ,0x3d2,"int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
  process->loop = loop;
  process->type = UV_PROCESS;
  process->flags = 8;
  (process->handle_queue).next = &loop->handle_queue;
  puVar2 = (loop->handle_queue).prev;
  (process->handle_queue).prev = puVar2;
  puVar2->next = &process->handle_queue;
  (loop->handle_queue).prev = &process->handle_queue;
  process->next_closing = (uv_handle_t *)0x0;
  puVar2 = &process->queue;
  (process->queue).next = puVar2;
  (process->queue).prev = puVar2;
  process->status = 0;
  uVar13 = options->stdio_count;
  uVar8 = 3;
  if (3 < (int)uVar13) {
    uVar8 = uVar13;
  }
  uVar14 = (ulong)uVar8;
  if ((int)uVar13 < 9) {
    pipes = (int (*) [2])local_178;
  }
  else {
    pipes = (int (*) [2])uv__malloc(uVar14 * 8);
  }
  local_180 = uVar14;
  if (pipes != (int (*) [2])0x0) {
    local_198 = process;
    local_190 = puVar2;
    local_188 = loop;
    memset(pipes,0xff,uVar14 * 8);
    if (0 < options->stdio_count) {
      lVar12 = 8;
      lVar17 = 0;
      fds = pipes;
      do {
        puVar3 = options->stdio;
        uVar6 = *(uint *)((long)puVar3 + lVar12 + -8);
        uVar13 = uVar6 & 7;
        switch(uVar13) {
        case 0:
          break;
        case 1:
          lVar4 = *(long *)((long)&puVar3->flags + lVar12);
          if (lVar4 == 0) {
            __assert_fail("container->data.stream != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/process.c"
                          ,0xca,"int uv__process_init_stdio(uv_stdio_container_t *, int *)");
          }
          uVar13 = 0xffffffea;
          if (*(int *)(lVar4 + 0x10) == 7) {
            uVar13 = uv_socketpair(1,0,*fds,0,0);
          }
          break;
        case 2:
        case 4:
          plVar9 = (long *)((long)&puVar3->flags + lVar12);
          if ((uVar6 & 2) == 0) {
            plVar9 = (long *)(*plVar9 + 0xb8);
          }
          if ((int)*plVar9 == -1) {
            uVar13 = 0xffffffea;
          }
          else {
            (*fds)[1] = (int)*plVar9;
            uVar13 = 0;
          }
          break;
        default:
          __assert_fail("0 && \"Unexpected flags\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/process.c"
                        ,0xde,"int uv__process_init_stdio(uv_stdio_container_t *, int *)");
        }
        if (uVar13 != 0) goto LAB_00156dfe;
        lVar17 = lVar17 + 1;
        fds = fds + 1;
        lVar12 = lVar12 + 0x10;
      } while (lVar17 < options->stdio_count);
    }
    puVar5 = local_188;
    uv_signal_start(&local_188->child_watcher,uv__chld,0x11);
    local_1a8 = 0xffffffffffffffff;
    uVar6 = uv__make_pipe((int *)&local_1a8,0);
    puVar16 = local_198;
    uVar13 = uVar6;
    if (uVar6 == 0) {
      uv_rwlock_wrlock(&puVar5->cloexec_lock);
      local_19c = local_1a8._4_4_;
      sigfillset(&local_b0);
      sigdelset(&local_b0,9);
      sigdelset(&local_b0,0x13);
      sigdelset(&local_b0,5);
      sigdelset(&local_b0,0xb);
      sigdelset(&local_b0,7);
      sigdelset(&local_b0,4);
      sigdelset(&local_b0,0x1f);
      sigdelset(&local_b0,6);
      iVar7 = pthread_sigmask(0,&local_b0,&local_130);
      puVar16 = local_198;
      if (iVar7 != 0) {
LAB_00156f52:
        abort();
      }
      uVar6 = fork();
      if (uVar6 == 0) {
        uv__process_child_init(options,uVar8,pipes,local_19c);
LAB_00156fe8:
        __assert_fail("err == *pid",
                      "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/process.c"
                      ,0x3a9,
                      "int uv__spawn_and_init_child(uv_loop_t *, const uv_process_options_t *, int, int (*)[2], pid_t *)"
                     );
      }
      uVar13 = 0;
      iVar7 = pthread_sigmask(2,&local_130,(__sigset_t *)0x0);
      if (iVar7 != 0) goto LAB_00156f52;
      if (uVar6 == 0xffffffff) {
        piVar10 = __errno_location();
        uVar13 = -*piVar10;
      }
      uv_rwlock_wrunlock(&puVar5->cloexec_lock);
      uv__close(local_1a8._4_4_);
      if (uVar13 == 0) {
        do {
          sVar11 = read((int)local_1a8,&local_130,4);
          if (sVar11 != -1) break;
          piVar10 = __errno_location();
        } while (*piVar10 == 4);
        if (sVar11 != 0) {
          if (sVar11 == 4) {
            do {
              uVar8 = waitpid(uVar6,(int *)&local_b0,0);
              if (uVar8 != 0xffffffff) break;
              piVar10 = __errno_location();
            } while (*piVar10 == 4);
            uVar13 = (uint)local_130.__val[0];
            if (uVar8 != uVar6) goto LAB_00156fe8;
          }
          else {
            if ((sVar11 != -1) || (piVar10 = __errno_location(), *piVar10 != 0x20))
            goto LAB_00156f52;
            do {
              uVar8 = waitpid(uVar6,(int *)&local_b0,0);
              if (uVar8 != 0xffffffff) break;
            } while (*piVar10 == 4);
            uVar13 = 0xffffffe0;
            if (uVar8 != uVar6) {
              __assert_fail("err == *pid",
                            "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/process.c"
                            ,0x3b0,
                            "int uv__spawn_and_init_child(uv_loop_t *, const uv_process_options_t *, int, int (*)[2], pid_t *)"
                           );
            }
          }
        }
      }
      uv__close_nocheckstdio((int)local_1a8);
    }
    if (uVar13 == 0) {
      puVar16->pid = uVar6;
      puVar16->exit_cb = options->exit_cb;
      (puVar16->queue).next = &puVar5->process_handles;
      puVar2 = (puVar5->process_handles).prev;
      (puVar16->queue).prev = puVar2;
      puVar2->next = local_190;
      (puVar5->process_handles).prev = local_190;
      uVar8 = puVar16->flags;
      if (((uVar8 & 4) == 0) && (puVar16->flags = uVar8 | 4, (uVar8 & 8) != 0)) {
        puVar1 = &puVar16->loop->active_handles;
        *puVar1 = *puVar1 + 1;
      }
    }
    if (0 < options->stdio_count) {
      lVar12 = 0;
      lVar17 = 0;
      do {
        puVar3 = options->stdio;
        uVar8 = 0;
        if (((*(byte *)((long)&puVar3->flags + lVar12) & 1) != 0) && (-1 < pipes[lVar17][0])) {
          iVar7 = uv__close(pipes[lVar17][1]);
          if (iVar7 != 0) goto LAB_00156f52;
          pipes[lVar17][1] = -1;
          uv__nonblock_ioctl(pipes[lVar17][0],1);
          uVar8 = *(uint *)((long)&puVar3->flags + lVar12);
          uVar8 = uv__stream_open(*(uv_stream_t **)((long)&puVar3->data + lVar12),pipes[lVar17][0],
                                  (uVar8 & 0x10) << 0xb | (uVar8 & 0x20) << 9);
        }
        if (uVar8 != 0) goto joined_r0x00156ddd;
        lVar17 = lVar17 + 1;
        lVar12 = lVar12 + 0x10;
      } while (lVar17 < options->stdio_count);
    }
    goto LAB_00156e54;
  }
  uVar13 = 0xfffffff4;
LAB_00156dfe:
  uVar14 = local_180;
  if (pipes == (int (*) [2])0x0) {
    return uVar13;
  }
  uVar15 = 0;
  do {
    if (((long)options->stdio_count <= (long)uVar15) ||
       ((options->stdio[uVar15].flags & (UV_INHERIT_STREAM|UV_INHERIT_FD)) == UV_IGNORE)) {
      if (pipes[uVar15][0] != -1) {
        uv__close_nocheckstdio(pipes[uVar15][0]);
      }
      if (pipes[uVar15][1] != -1) {
        uv__close_nocheckstdio(pipes[uVar15][1]);
      }
    }
    uVar15 = uVar15 + 1;
  } while (uVar15 != uVar14);
LAB_00156e54:
  if (pipes != (int (*) [2])local_178) {
    uv__free(pipes);
  }
  return uVar13;
joined_r0x00156ddd:
  for (; uVar13 = uVar8, lVar12 != 0; lVar12 = lVar12 + -0x10) {
    if ((*(byte *)((long)&options->stdio[-1].flags + lVar12) & 1) != 0) {
      uv__stream_close(*(uv_stream_t **)((long)options->stdio + lVar12 + -8));
    }
  }
  goto LAB_00156dfe;
}

Assistant:

int uv_spawn(uv_loop_t* loop,
             uv_process_t* process,
             const uv_process_options_t* options) {
#if defined(__APPLE__) && (TARGET_OS_TV || TARGET_OS_WATCH)
  /* fork is marked __WATCHOS_PROHIBITED __TVOS_PROHIBITED. */
  return UV_ENOSYS;
#else
  int pipes_storage[8][2];
  int (*pipes)[2];
  int stdio_count;
  pid_t pid;
  int err;
  int exec_errorno;
  int i;

  assert(options->file != NULL);
  assert(!(options->flags & ~(UV_PROCESS_DETACHED |
                              UV_PROCESS_SETGID |
                              UV_PROCESS_SETUID |
                              UV_PROCESS_WINDOWS_HIDE |
                              UV_PROCESS_WINDOWS_HIDE_CONSOLE |
                              UV_PROCESS_WINDOWS_HIDE_GUI |
                              UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS)));

  uv__handle_init(loop, (uv_handle_t*)process, UV_PROCESS);
  uv__queue_init(&process->queue);
  process->status = 0;

  stdio_count = options->stdio_count;
  if (stdio_count < 3)
    stdio_count = 3;

  err = UV_ENOMEM;
  pipes = pipes_storage;
  if (stdio_count > (int) ARRAY_SIZE(pipes_storage))
    pipes = uv__malloc(stdio_count * sizeof(*pipes));

  if (pipes == NULL)
    goto error;

  for (i = 0; i < stdio_count; i++) {
    pipes[i][0] = -1;
    pipes[i][1] = -1;
  }

  for (i = 0; i < options->stdio_count; i++) {
    err = uv__process_init_stdio(options->stdio + i, pipes[i]);
    if (err)
      goto error;
  }

#ifdef UV_USE_SIGCHLD
  uv_signal_start(&loop->child_watcher, uv__chld, SIGCHLD);
#endif

  /* Spawn the child */
  exec_errorno = uv__spawn_and_init_child(loop, options, stdio_count, pipes, &pid);

#if 0
  /* This runs into a nodejs issue (it expects initialized streams, even if the
   * exec failed).
   * See https://github.com/libuv/libuv/pull/3107#issuecomment-782482608 */
  if (exec_errorno != 0)
      goto error;
#endif

  /* Activate this handle if exec() happened successfully, even if we later
   * fail to open a stdio handle. This ensures we can eventually reap the child
   * with waitpid. */
  if (exec_errorno == 0) {
#ifndef UV_USE_SIGCHLD
    struct kevent event;
    EV_SET(&event, pid, EVFILT_PROC, EV_ADD | EV_ONESHOT, NOTE_EXIT, 0, 0);
    if (kevent(loop->backend_fd, &event, 1, NULL, 0, NULL)) {
      if (errno != ESRCH)
        abort();
      /* Process already exited. Call waitpid on the next loop iteration. */
      process->flags |= UV_HANDLE_REAP;
      loop->flags |= UV_LOOP_REAP_CHILDREN;
    }
    /* This prevents uv__io_poll() from bailing out prematurely, being unaware
     * that we added an event here for it to react to. We will decrement this
     * again after the waitpid call succeeds. */
    loop->nfds++;
#endif

    process->pid = pid;
    process->exit_cb = options->exit_cb;
    uv__queue_insert_tail(&loop->process_handles, &process->queue);
    uv__handle_start(process);
  }

  for (i = 0; i < options->stdio_count; i++) {
    err = uv__process_open_stream(options->stdio + i, pipes[i]);
    if (err == 0)
      continue;

    while (i--)
      uv__process_close_stream(options->stdio + i);

    goto error;
  }

  if (pipes != pipes_storage)
    uv__free(pipes);

  return exec_errorno;

error:
  if (pipes != NULL) {
    for (i = 0; i < stdio_count; i++) {
      if (i < options->stdio_count)
        if (options->stdio[i].flags & (UV_INHERIT_FD | UV_INHERIT_STREAM))
          continue;
      if (pipes[i][0] != -1)
        uv__close_nocheckstdio(pipes[i][0]);
      if (pipes[i][1] != -1)
        uv__close_nocheckstdio(pipes[i][1]);
    }

    if (pipes != pipes_storage)
      uv__free(pipes);
  }

  return err;
#endif
}